

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O2

int get_topology(msr_topology *topo,uint32_t ncpus)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  int *piVar4;
  stat *psVar5;
  ulong uVar6;
  char *pcVar7;
  uint32_t *puVar8;
  char fname [92];
  stat local_c8;
  
  puVar8 = &topo->die;
  uVar6 = 0;
  while( true ) {
    if (ncpus == uVar6) {
      return 0;
    }
    local_c8.st_atim.tv_nsec._0_4_ = 0;
    local_c8._84_8_ = 0;
    local_c8.st_blocks = 0;
    local_c8.st_atim.tv_sec._0_4_ = 0;
    local_c8.st_atim.tv_sec._4_4_ = 0;
    local_c8.st_size = 0;
    local_c8.st_blksize = 0;
    local_c8.st_gid = 0;
    local_c8.__pad0 = 0;
    local_c8.st_rdev = 0;
    local_c8.st_nlink = 0;
    local_c8.st_mode = 0;
    local_c8.st_uid = 0;
    local_c8.st_dev = 0;
    local_c8.st_ino = 0;
    snprintf((char *)&local_c8,0x5c,"/sys/devices/system/cpu/cpu%u/topology/physical_package_id",
             uVar6 & 0xffffffff);
    pFVar3 = fopen((char *)&local_c8,"r");
    if (pFVar3 == (FILE *)0x0) break;
    iVar1 = __isoc99_fscanf(pFVar3,"%u",(msr_topology *)(puVar8 + -1));
    iVar2 = fclose(pFVar3);
    if (iVar2 != 0) {
      fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
      pFVar3 = _stderr;
      piVar4 = __errno_location();
      pcVar7 = strerror(*piVar4);
      fprintf(pFVar3,"%s: %s\n","get_physical_package_id: fclose",pcVar7);
    }
    if (iVar1 != 1) {
      fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
      pcVar7 = "get_physical_package_id: Failed to read physical_package_id for cpu%u\n";
LAB_001050e5:
      fprintf(_stderr,pcVar7,uVar6 & 0xffffffff);
      piVar4 = __errno_location();
      *piVar4 = 0x3d;
      return -1;
    }
    fname[0x50] = '\0';
    fname[0x51] = '\0';
    fname[0x52] = '\0';
    fname[0x53] = '\0';
    fname[0x54] = '\0';
    fname[0x55] = '\0';
    fname[0x56] = '\0';
    fname[0x57] = '\0';
    fname[0x58] = '\0';
    fname[0x59] = '\0';
    fname[0x5a] = '\0';
    fname[0x5b] = '\0';
    fname[0x40] = '\0';
    fname[0x41] = '\0';
    fname[0x42] = '\0';
    fname[0x43] = '\0';
    fname[0x44] = '\0';
    fname[0x45] = '\0';
    fname[0x46] = '\0';
    fname[0x47] = '\0';
    fname[0x48] = '\0';
    fname[0x49] = '\0';
    fname[0x4a] = '\0';
    fname[0x4b] = '\0';
    fname[0x4c] = '\0';
    fname[0x4d] = '\0';
    fname[0x4e] = '\0';
    fname[0x4f] = '\0';
    fname[0x30] = '\0';
    fname[0x31] = '\0';
    fname[0x32] = '\0';
    fname[0x33] = '\0';
    fname[0x34] = '\0';
    fname[0x35] = '\0';
    fname[0x36] = '\0';
    fname[0x37] = '\0';
    fname[0x38] = '\0';
    fname[0x39] = '\0';
    fname[0x3a] = '\0';
    fname[0x3b] = '\0';
    fname[0x3c] = '\0';
    fname[0x3d] = '\0';
    fname[0x3e] = '\0';
    fname[0x3f] = '\0';
    fname[0x20] = '\0';
    fname[0x21] = '\0';
    fname[0x22] = '\0';
    fname[0x23] = '\0';
    fname[0x24] = '\0';
    fname[0x25] = '\0';
    fname[0x26] = '\0';
    fname[0x27] = '\0';
    fname[0x28] = '\0';
    fname[0x29] = '\0';
    fname[0x2a] = '\0';
    fname[0x2b] = '\0';
    fname[0x2c] = '\0';
    fname[0x2d] = '\0';
    fname[0x2e] = '\0';
    fname[0x2f] = '\0';
    fname[0x10] = '\0';
    fname[0x11] = '\0';
    fname[0x12] = '\0';
    fname[0x13] = '\0';
    fname[0x14] = '\0';
    fname[0x15] = '\0';
    fname[0x16] = '\0';
    fname[0x17] = '\0';
    fname[0x18] = '\0';
    fname[0x19] = '\0';
    fname[0x1a] = '\0';
    fname[0x1b] = '\0';
    fname[0x1c] = '\0';
    fname[0x1d] = '\0';
    fname[0x1e] = '\0';
    fname[0x1f] = '\0';
    fname[0] = '\0';
    fname[1] = '\0';
    fname[2] = '\0';
    fname[3] = '\0';
    fname[4] = '\0';
    fname[5] = '\0';
    fname[6] = '\0';
    fname[7] = '\0';
    fname[8] = '\0';
    fname[9] = '\0';
    fname[10] = '\0';
    fname[0xb] = '\0';
    fname[0xc] = '\0';
    fname[0xd] = '\0';
    fname[0xe] = '\0';
    fname[0xf] = '\0';
    snprintf(fname,0x5c,"/sys/devices/system/cpu/cpu%u/topology/die_id",uVar6 & 0xffffffff);
    iVar1 = stat(fname,&local_c8);
    if (iVar1 == 0) {
      pFVar3 = fopen(fname,"r");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
        pFVar3 = _stderr;
        piVar4 = __errno_location();
        pcVar7 = strerror(*piVar4);
        psVar5 = (stat *)fname;
        goto LAB_001050a6;
      }
      iVar1 = __isoc99_fscanf(pFVar3,"%u",puVar8);
      iVar2 = fclose(pFVar3);
      if (iVar2 != 0) {
        fprintf(_stderr,"%s [%s] ","[WARN] ","raplcap-msr");
        pFVar3 = _stderr;
        piVar4 = __errno_location();
        pcVar7 = strerror(*piVar4);
        fprintf(pFVar3,"%s: %s\n","get_die_id: fclose",pcVar7);
      }
      if (iVar1 != 1) {
        fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
        pcVar7 = "get_die_id: Failed to read die_id for cpu%u\n";
        goto LAB_001050e5;
      }
    }
    else {
      *puVar8 = 0;
    }
    puVar8[1] = (uint32_t)uVar6;
    uVar6 = uVar6 + 1;
    puVar8 = puVar8 + 3;
  }
  fprintf(_stderr,"%s [%s] ","[ERROR]","raplcap-msr");
  pFVar3 = _stderr;
  piVar4 = __errno_location();
  pcVar7 = strerror(*piVar4);
  psVar5 = &local_c8;
LAB_001050a6:
  fprintf(pFVar3,"%s: %s\n",psVar5,pcVar7);
  return -1;
}

Assistant:

static int get_topology(msr_topology* topo, uint32_t ncpus) {
  // assumes cpus are numbered from 0 to ncpus-1
  uint32_t i;
  for (i = 0; i < ncpus; i++) {
    if (get_physical_package_id(i, &topo[i].pkg) < 0) {
      return -1;
    }
    if (get_die_id(i, &topo[i].die) < 0) {
      return -1;
    }
    topo[i].cpu = i;
  }
  return 0;
}